

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O1

int __thiscall
soul::Optimisations::Inliner::clone
          (Inliner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *pMVar1;
  Expression *args_1;
  ReadStream *pRVar2;
  
  if (*(Expression **)(__fn + 0x20) != (Expression *)0x0) {
    pMVar1 = this->module;
    args_1 = cloneExpression(this,*(Expression **)(__fn + 0x20));
    pRVar2 = PoolAllocator::
             allocate<soul::heart::ReadStream,soul::CodeLocation_const&,soul::heart::Expression&,soul::pool_ref<soul::heart::InputDeclaration>const&>
                       (&pMVar1->allocator->pool,(CodeLocation *)(__fn + 8),args_1,
                        (pool_ref<soul::heart::InputDeclaration> *)(__fn + 0x28));
    return (int)pRVar2;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

heart::ReadStream& clone (const heart::ReadStream& old)
        {
            return module.allocate<heart::ReadStream> (old.location, cloneExpression (*old.target), old.source);
        }